

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall ON_wString::Duplicate(ON_wString *this)

{
  int iVar1;
  ON_wString *in_RSI;
  ON_wString *this_local;
  ON_wString *s;
  
  iVar1 = Length(in_RSI);
  if (iVar1 < 1) {
    ON_wString(this,&EmptyString);
  }
  else {
    ON_wString(this,in_RSI);
    CopyArray(this);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::Duplicate() const
{
  if (Length() <= 0)
    return ON_wString::EmptyString;
  ON_wString s = *this;
  s.CopyArray();
  return s;
}